

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufSetInputBaseCur(xmlBufPtr buf,xmlParserInputPtr input,size_t base,size_t cur)

{
  size_t cur_local;
  size_t base_local;
  xmlParserInputPtr input_local;
  xmlBufPtr buf_local;
  
  if (input == (xmlParserInputPtr)0x0) {
    buf_local._4_4_ = -1;
  }
  else if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
    input->end = "";
    input->cur = "";
    input->base = "";
    buf_local._4_4_ = -1;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    input->base = buf->content + base;
    input->cur = input->base + cur;
    input->end = buf->content + buf->use;
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufSetInputBaseCur(xmlBufPtr buf, xmlParserInputPtr input,
                      size_t base, size_t cur) {
    if (input == NULL)
        return(-1);
    if ((buf == NULL) || (buf->error)) {
        input->base = input->cur = input->end = BAD_CAST "";
        return(-1);
    }
    CHECK_COMPAT(buf)
    input->base = &buf->content[base];
    input->cur = input->base + cur;
    input->end = &buf->content[buf->use];
    return(0);
}